

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 (*pauVar44) [16];
  int iVar45;
  ulong *puVar46;
  int *piVar47;
  Scene *pSVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [16];
  undefined4 uVar58;
  ulong unaff_R12;
  size_t mask;
  long lVar59;
  ulong uVar60;
  long lVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar69;
  float fVar70;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar113;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  uint uVar119;
  uint uVar124;
  uint uVar125;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  uint uVar126;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  float fVar130;
  float fVar132;
  float fVar133;
  undefined1 auVar131 [16];
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2660;
  undefined8 uStack_2658;
  int local_2634;
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  RTCIntersectArguments *local_25d8;
  RTCFilterFunctionNArguments local_25d0;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  float local_2580;
  undefined4 local_257c;
  undefined4 local_2578;
  float local_2574;
  float local_2570;
  undefined4 local_256c;
  uint local_2568;
  uint local_2564;
  uint local_2560;
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_24f0 [16];
  float local_24e0 [4];
  float local_24d0 [4];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      pauVar57 = (undefined1 (*) [16])local_2390;
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar72 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar85 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar100._8_4_ = 0x7fffffff;
      auVar100._0_8_ = 0x7fffffff7fffffff;
      auVar100._12_4_ = 0x7fffffff;
      auVar100 = vandps_avx((undefined1  [16])aVar2,auVar100);
      auVar104._8_4_ = 0x219392ef;
      auVar104._0_8_ = 0x219392ef219392ef;
      auVar104._12_4_ = 0x219392ef;
      auVar100 = vcmpps_avx(auVar100,auVar104,1);
      auVar100 = vblendvps_avx((undefined1  [16])aVar2,auVar104,auVar100);
      auVar104 = vrcpps_avx(auVar100);
      fVar62 = auVar104._0_4_;
      auVar93._0_4_ = auVar100._0_4_ * fVar62;
      fVar69 = auVar104._4_4_;
      auVar93._4_4_ = auVar100._4_4_ * fVar69;
      fVar70 = auVar104._8_4_;
      auVar93._8_4_ = auVar100._8_4_ * fVar70;
      fVar71 = auVar104._12_4_;
      auVar93._12_4_ = auVar100._12_4_ * fVar71;
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar100 = vsubps_avx(auVar105,auVar93);
      auVar94._0_4_ = fVar62 + fVar62 * auVar100._0_4_;
      auVar94._4_4_ = fVar69 + fVar69 * auVar100._4_4_;
      auVar94._8_4_ = fVar70 + fVar70 * auVar100._8_4_;
      auVar94._12_4_ = fVar71 + fVar71 * auVar100._12_4_;
      uVar58 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_2420._4_4_ = uVar58;
      local_2420._0_4_ = uVar58;
      local_2420._8_4_ = uVar58;
      local_2420._12_4_ = uVar58;
      local_2420._16_4_ = uVar58;
      local_2420._20_4_ = uVar58;
      local_2420._24_4_ = uVar58;
      local_2420._28_4_ = uVar58;
      auVar139 = ZEXT3264(local_2420);
      uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2440._4_4_ = uVar58;
      local_2440._0_4_ = uVar58;
      local_2440._8_4_ = uVar58;
      local_2440._12_4_ = uVar58;
      local_2440._16_4_ = uVar58;
      local_2440._20_4_ = uVar58;
      local_2440._24_4_ = uVar58;
      local_2440._28_4_ = uVar58;
      auVar140 = ZEXT3264(local_2440);
      uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2460._4_4_ = uVar58;
      local_2460._0_4_ = uVar58;
      local_2460._8_4_ = uVar58;
      local_2460._12_4_ = uVar58;
      local_2460._16_4_ = uVar58;
      local_2460._20_4_ = uVar58;
      local_2460._24_4_ = uVar58;
      local_2460._28_4_ = uVar58;
      auVar142 = ZEXT3264(local_2460);
      auVar100 = vshufps_avx(auVar94,auVar94,0);
      local_2480._16_16_ = auVar100;
      local_2480._0_16_ = auVar100;
      auVar144 = ZEXT3264(local_2480);
      auVar100 = vmovshdup_avx(auVar94);
      auVar104 = vshufps_avx(auVar94,auVar94,0x55);
      local_23c0._16_16_ = auVar104;
      local_23c0._0_16_ = auVar104;
      auVar104 = vshufpd_avx(auVar94,auVar94,1);
      auVar93 = vshufps_avx(auVar94,auVar94,0xaa);
      local_23e0._16_16_ = auVar93;
      local_23e0._0_16_ = auVar93;
      auVar72 = vshufps_avx(auVar72,auVar72,0);
      local_2400._16_16_ = auVar72;
      local_2400._0_16_ = auVar72;
      auVar72 = vshufps_avx(auVar85,auVar85,0);
      auVar68 = ZEXT3264(CONCAT1616(auVar72,auVar72));
      uVar52 = (ulong)(auVar94._0_4_ < 0.0) << 3;
      uVar55 = uVar52 ^ 8;
      uVar56 = (ulong)((uint)(auVar100._0_4_ < 0.0) * 8 + 0x10);
      uVar60 = (ulong)((uint)(auVar104._0_4_ < 0.0) * 8 + 0x20);
      local_2550 = mm_lookupmask_ps._240_8_;
      uStack_2548 = mm_lookupmask_ps._248_8_;
      do {
        do {
          do {
            if (pauVar57 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar44 = pauVar57 + -1;
            pauVar57 = pauVar57 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar44 + 8));
          uVar50 = *(ulong *)*pauVar57;
          do {
            if ((uVar50 & 8) == 0) {
              puVar46 = (ulong *)((uVar50 & 0xfffffffffffffff0) + 0x40);
              if ((uVar50 & 0xfffffffffffffff0) == 0) {
                puVar46 = (ulong *)0x0;
              }
              auVar72._8_8_ = 0;
              auVar72._0_8_ = *puVar46;
              auVar95._8_8_ = 0;
              auVar95._0_8_ = puVar46[1];
              auVar100 = vpminub_avx(auVar72,auVar95);
              auVar100 = vpcmpeqb_avx(auVar72,auVar100);
              auVar85._8_8_ = 0;
              auVar85._0_8_ = *(ulong *)((long)puVar46 + 4);
              auVar101._8_8_ = 0;
              auVar101._0_8_ = *(ulong *)((long)puVar46 + 0xc);
              auVar72 = vpminub_avx(auVar85,auVar101);
              fVar62 = *(float *)(puVar46 + 6);
              auVar72 = vpcmpeqb_avx(auVar85,auVar72);
              fVar69 = *(float *)((long)puVar46 + 0x3c);
              auVar96._8_8_ = 0;
              auVar96._0_8_ = *(ulong *)((long)puVar46 + uVar52);
              auVar85 = vpmovzxbd_avx(auVar96);
              auVar109._8_8_ = 0;
              auVar109._0_8_ = *(ulong *)((long)puVar46 + uVar52 + 4);
              auVar104 = vpmovzxbd_avx(auVar109);
              auVar98._16_16_ = auVar104;
              auVar98._0_16_ = auVar85;
              auVar98 = vcvtdq2ps_avx(auVar98);
              auVar99._0_4_ = fVar62 + fVar69 * auVar98._0_4_;
              auVar99._4_4_ = fVar62 + fVar69 * auVar98._4_4_;
              auVar99._8_4_ = fVar62 + fVar69 * auVar98._8_4_;
              auVar99._12_4_ = fVar62 + fVar69 * auVar98._12_4_;
              auVar99._16_4_ = fVar62 + fVar69 * auVar98._16_4_;
              auVar99._20_4_ = fVar62 + fVar69 * auVar98._20_4_;
              auVar99._24_4_ = fVar62 + fVar69 * auVar98._24_4_;
              auVar99._28_4_ = fVar62 + auVar98._28_4_;
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)((long)puVar46 + uVar55);
              auVar85 = vpmovzxbd_avx(auVar110);
              auVar114._8_8_ = 0;
              auVar114._0_8_ = *(ulong *)((long)puVar46 + uVar55 + 4);
              auVar104 = vpmovzxbd_avx(auVar114);
              auVar111._16_16_ = auVar104;
              auVar111._0_16_ = auVar85;
              auVar98 = vcvtdq2ps_avx(auVar111);
              fVar70 = *(float *)((long)puVar46 + 0x34);
              auVar103._0_4_ = fVar62 + fVar69 * auVar98._0_4_;
              auVar103._4_4_ = fVar62 + fVar69 * auVar98._4_4_;
              auVar103._8_4_ = fVar62 + fVar69 * auVar98._8_4_;
              auVar103._12_4_ = fVar62 + fVar69 * auVar98._12_4_;
              auVar103._16_4_ = fVar62 + fVar69 * auVar98._16_4_;
              auVar103._20_4_ = fVar62 + fVar69 * auVar98._20_4_;
              auVar103._24_4_ = fVar62 + fVar69 * auVar98._24_4_;
              auVar103._28_4_ = fVar62 + fVar69;
              fVar62 = *(float *)(puVar46 + 8);
              auVar106._8_8_ = 0;
              auVar106._0_8_ = *(ulong *)((long)puVar46 + uVar56);
              auVar85 = vpmovzxbd_avx(auVar106);
              auVar116._8_8_ = 0;
              auVar116._0_8_ = *(ulong *)((long)puVar46 + uVar56 + 4);
              auVar104 = vpmovzxbd_avx(auVar116);
              auVar107._16_16_ = auVar104;
              auVar107._0_16_ = auVar85;
              auVar98 = vcvtdq2ps_avx(auVar107);
              auVar108._0_4_ = fVar70 + fVar62 * auVar98._0_4_;
              auVar108._4_4_ = fVar70 + fVar62 * auVar98._4_4_;
              auVar108._8_4_ = fVar70 + fVar62 * auVar98._8_4_;
              auVar108._12_4_ = fVar70 + fVar62 * auVar98._12_4_;
              auVar108._16_4_ = fVar70 + fVar62 * auVar98._16_4_;
              auVar108._20_4_ = fVar70 + fVar62 * auVar98._20_4_;
              auVar108._24_4_ = fVar70 + fVar62 * auVar98._24_4_;
              auVar108._28_4_ = fVar70 + auVar98._28_4_;
              auVar117._8_8_ = 0;
              auVar117._0_8_ = *(ulong *)((long)puVar46 + (uVar56 ^ 8));
              auVar85 = vpmovzxbd_avx(auVar117);
              auVar120._8_8_ = 0;
              auVar120._0_8_ = *(ulong *)((long)puVar46 + (uVar56 ^ 8) + 4);
              auVar104 = vpmovzxbd_avx(auVar120);
              auVar118._16_16_ = auVar104;
              auVar118._0_16_ = auVar85;
              auVar98 = vcvtdq2ps_avx(auVar118);
              fVar69 = *(float *)(puVar46 + 7);
              auVar112._0_4_ = fVar70 + auVar98._0_4_ * fVar62;
              auVar112._4_4_ = fVar70 + auVar98._4_4_ * fVar62;
              auVar112._8_4_ = fVar70 + auVar98._8_4_ * fVar62;
              auVar112._12_4_ = fVar70 + auVar98._12_4_ * fVar62;
              auVar112._16_4_ = fVar70 + auVar98._16_4_ * fVar62;
              auVar112._20_4_ = fVar70 + auVar98._20_4_ * fVar62;
              auVar112._24_4_ = fVar70 + auVar98._24_4_ * fVar62;
              auVar112._28_4_ = fVar70 + fVar62;
              fVar62 = *(float *)((long)puVar46 + 0x44);
              auVar121._8_8_ = 0;
              auVar121._0_8_ = *(ulong *)((long)puVar46 + uVar60);
              auVar85 = vpmovzxbd_avx(auVar121);
              auVar127._8_8_ = 0;
              auVar127._0_8_ = *(ulong *)((long)puVar46 + uVar60 + 4);
              auVar104 = vpmovzxbd_avx(auVar127);
              auVar122._16_16_ = auVar104;
              auVar122._0_16_ = auVar85;
              auVar128._8_8_ = 0;
              auVar128._0_8_ = *(ulong *)((long)puVar46 + (uVar60 ^ 8));
              auVar85 = vpmovzxbd_avx(auVar128);
              auVar131._8_8_ = 0;
              auVar131._0_8_ = *(ulong *)((long)puVar46 + (uVar60 ^ 8) + 4);
              auVar104 = vpmovzxbd_avx(auVar131);
              auVar129._16_16_ = auVar104;
              auVar129._0_16_ = auVar85;
              auVar98 = vcvtdq2ps_avx(auVar122);
              auVar6 = vcvtdq2ps_avx(auVar129);
              auVar123._0_4_ = fVar69 + auVar98._0_4_ * fVar62;
              auVar123._4_4_ = fVar69 + auVar98._4_4_ * fVar62;
              auVar123._8_4_ = fVar69 + auVar98._8_4_ * fVar62;
              auVar123._12_4_ = fVar69 + auVar98._12_4_ * fVar62;
              auVar123._16_4_ = fVar69 + auVar98._16_4_ * fVar62;
              auVar123._20_4_ = fVar69 + auVar98._20_4_ * fVar62;
              auVar123._24_4_ = fVar69 + auVar98._24_4_ * fVar62;
              auVar123._28_4_ = fVar69 + auVar98._28_4_;
              auVar115._0_4_ = fVar69 + auVar6._0_4_ * fVar62;
              auVar115._4_4_ = fVar69 + auVar6._4_4_ * fVar62;
              auVar115._8_4_ = fVar69 + auVar6._8_4_ * fVar62;
              auVar115._12_4_ = fVar69 + auVar6._12_4_ * fVar62;
              auVar115._16_4_ = fVar69 + auVar6._16_4_ * fVar62;
              auVar115._20_4_ = fVar69 + auVar6._20_4_ * fVar62;
              auVar115._24_4_ = fVar69 + auVar6._24_4_ * fVar62;
              auVar115._28_4_ = fVar69 + fVar62;
              auVar98 = vsubps_avx(auVar99,auVar139._0_32_);
              auVar6._4_4_ = auVar144._4_4_ * auVar98._4_4_;
              auVar6._0_4_ = auVar144._0_4_ * auVar98._0_4_;
              auVar6._8_4_ = auVar144._8_4_ * auVar98._8_4_;
              auVar6._12_4_ = auVar144._12_4_ * auVar98._12_4_;
              auVar6._16_4_ = auVar144._16_4_ * auVar98._16_4_;
              auVar6._20_4_ = auVar144._20_4_ * auVar98._20_4_;
              auVar6._24_4_ = auVar144._24_4_ * auVar98._24_4_;
              auVar6._28_4_ = auVar98._28_4_;
              auVar98 = vsubps_avx(auVar108,auVar140._0_32_);
              auVar18._4_4_ = local_23c0._4_4_ * auVar98._4_4_;
              auVar18._0_4_ = local_23c0._0_4_ * auVar98._0_4_;
              auVar18._8_4_ = local_23c0._8_4_ * auVar98._8_4_;
              auVar18._12_4_ = local_23c0._12_4_ * auVar98._12_4_;
              auVar18._16_4_ = local_23c0._16_4_ * auVar98._16_4_;
              auVar18._20_4_ = local_23c0._20_4_ * auVar98._20_4_;
              auVar18._24_4_ = local_23c0._24_4_ * auVar98._24_4_;
              auVar18._28_4_ = auVar98._28_4_;
              auVar98 = vmaxps_avx(auVar6,auVar18);
              auVar6 = vsubps_avx(auVar123,auVar142._0_32_);
              auVar19._4_4_ = local_23e0._4_4_ * auVar6._4_4_;
              auVar19._0_4_ = local_23e0._0_4_ * auVar6._0_4_;
              auVar19._8_4_ = local_23e0._8_4_ * auVar6._8_4_;
              auVar19._12_4_ = local_23e0._12_4_ * auVar6._12_4_;
              auVar19._16_4_ = local_23e0._16_4_ * auVar6._16_4_;
              auVar19._20_4_ = local_23e0._20_4_ * auVar6._20_4_;
              auVar19._24_4_ = local_23e0._24_4_ * auVar6._24_4_;
              auVar19._28_4_ = auVar6._28_4_;
              auVar6 = vmaxps_avx(auVar19,local_2400);
              local_2540 = vmaxps_avx(auVar98,auVar6);
              auVar98 = vsubps_avx(auVar103,auVar139._0_32_);
              auVar20._4_4_ = auVar144._4_4_ * auVar98._4_4_;
              auVar20._0_4_ = auVar144._0_4_ * auVar98._0_4_;
              auVar20._8_4_ = auVar144._8_4_ * auVar98._8_4_;
              auVar20._12_4_ = auVar144._12_4_ * auVar98._12_4_;
              auVar20._16_4_ = auVar144._16_4_ * auVar98._16_4_;
              auVar20._20_4_ = auVar144._20_4_ * auVar98._20_4_;
              auVar20._24_4_ = auVar144._24_4_ * auVar98._24_4_;
              auVar20._28_4_ = auVar98._28_4_;
              auVar98 = vsubps_avx(auVar112,auVar140._0_32_);
              auVar21._4_4_ = local_23c0._4_4_ * auVar98._4_4_;
              auVar21._0_4_ = local_23c0._0_4_ * auVar98._0_4_;
              auVar21._8_4_ = local_23c0._8_4_ * auVar98._8_4_;
              auVar21._12_4_ = local_23c0._12_4_ * auVar98._12_4_;
              auVar21._16_4_ = local_23c0._16_4_ * auVar98._16_4_;
              auVar21._20_4_ = local_23c0._20_4_ * auVar98._20_4_;
              auVar21._24_4_ = local_23c0._24_4_ * auVar98._24_4_;
              auVar21._28_4_ = auVar98._28_4_;
              auVar98 = vminps_avx(auVar20,auVar21);
              auVar6 = vsubps_avx(auVar115,auVar142._0_32_);
              auVar22._4_4_ = local_23e0._4_4_ * auVar6._4_4_;
              auVar22._0_4_ = local_23e0._0_4_ * auVar6._0_4_;
              auVar22._8_4_ = local_23e0._8_4_ * auVar6._8_4_;
              auVar22._12_4_ = local_23e0._12_4_ * auVar6._12_4_;
              auVar22._16_4_ = local_23e0._16_4_ * auVar6._16_4_;
              auVar22._20_4_ = local_23e0._20_4_ * auVar6._20_4_;
              auVar22._24_4_ = local_23e0._24_4_ * auVar6._24_4_;
              auVar22._28_4_ = auVar6._28_4_;
              auVar6 = vminps_avx(auVar22,auVar68._0_32_);
              auVar6 = vminps_avx(auVar98,auVar6);
              auVar98 = vcmpps_avx(local_2540,auVar6,2);
              auVar85 = vpcmpeqd_avx(auVar6._0_16_,auVar6._0_16_);
              auVar100 = vpmovsxbd_avx(auVar100 ^ auVar85);
              auVar72 = vpmovsxbd_avx(auVar72 ^ auVar85);
              auVar84._16_16_ = auVar72;
              auVar84._0_16_ = auVar100;
              auVar6 = vcvtdq2ps_avx(auVar84);
              auVar92._8_4_ = 0xbf800000;
              auVar92._0_8_ = 0xbf800000bf800000;
              auVar92._12_4_ = 0xbf800000;
              auVar92._16_4_ = 0xbf800000;
              auVar92._20_4_ = 0xbf800000;
              auVar92._24_4_ = 0xbf800000;
              auVar92._28_4_ = 0xbf800000;
              auVar6 = vcmpps_avx(auVar92,auVar6,1);
              auVar98 = vandps_avx(auVar98,auVar6);
              uVar58 = vmovmskps_avx(auVar98);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar58);
            }
            if ((uVar50 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar45 = 4;
              }
              else {
                uVar49 = uVar50 & 0xfffffffffffffff0;
                lVar59 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                  }
                }
                iVar45 = 0;
                uVar50 = *(ulong *)(uVar49 + lVar59 * 8);
                uVar54 = unaff_R12 - 1 & unaff_R12;
                if (uVar54 != 0) {
                  uVar119 = *(uint *)(local_2540 + lVar59 * 4);
                  lVar59 = 0;
                  if (uVar54 != 0) {
                    for (; (uVar54 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                    }
                  }
                  uVar3 = *(ulong *)(uVar49 + lVar59 * 8);
                  uVar124 = *(uint *)(local_2540 + lVar59 * 4);
                  uVar54 = uVar54 - 1 & uVar54;
                  if (uVar54 == 0) {
                    if (uVar119 < uVar124) {
                      *(ulong *)*pauVar57 = uVar3;
                      *(uint *)(*pauVar57 + 8) = uVar124;
                      pauVar57 = pauVar57 + 1;
                    }
                    else {
                      *(ulong *)*pauVar57 = uVar50;
                      *(uint *)(*pauVar57 + 8) = uVar119;
                      uVar50 = uVar3;
                      pauVar57 = pauVar57 + 1;
                    }
                  }
                  else {
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar50;
                    auVar100 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar119));
                    auVar86._8_8_ = 0;
                    auVar86._0_8_ = uVar3;
                    auVar72 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar124));
                    lVar59 = 0;
                    if (uVar54 != 0) {
                      for (; (uVar54 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                      }
                    }
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = *(ulong *)(uVar49 + lVar59 * 8);
                    auVar85 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
                    uVar54 = uVar54 - 1 & uVar54;
                    if (uVar54 == 0) {
                      auVar104 = vpcmpgtd_avx(auVar72,auVar100);
                      auVar93 = vpshufd_avx(auVar104,0xaa);
                      auVar104 = vblendvps_avx(auVar72,auVar100,auVar93);
                      auVar100 = vblendvps_avx(auVar100,auVar72,auVar93);
                      auVar72 = vpcmpgtd_avx(auVar85,auVar104);
                      auVar93 = vpshufd_avx(auVar72,0xaa);
                      auVar72 = vblendvps_avx(auVar85,auVar104,auVar93);
                      auVar85 = vblendvps_avx(auVar104,auVar85,auVar93);
                      auVar104 = vpcmpgtd_avx(auVar85,auVar100);
                      auVar93 = vpshufd_avx(auVar104,0xaa);
                      auVar104 = vblendvps_avx(auVar85,auVar100,auVar93);
                      auVar100 = vblendvps_avx(auVar100,auVar85,auVar93);
                      *pauVar57 = auVar100;
                      pauVar57[1] = auVar104;
                      uVar50 = auVar72._0_8_;
                      pauVar57 = pauVar57 + 2;
                    }
                    else {
                      lVar59 = 0;
                      if (uVar54 != 0) {
                        for (; (uVar54 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                        }
                      }
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ = *(ulong *)(uVar49 + lVar59 * 8);
                      auVar104 = vpunpcklqdq_avx(auVar102,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)
                                                                 ));
                      uVar54 = uVar54 - 1 & uVar54;
                      if (uVar54 == 0) {
                        auVar93 = vpcmpgtd_avx(auVar72,auVar100);
                        auVar94 = vpshufd_avx(auVar93,0xaa);
                        auVar93 = vblendvps_avx(auVar72,auVar100,auVar94);
                        auVar100 = vblendvps_avx(auVar100,auVar72,auVar94);
                        auVar72 = vpcmpgtd_avx(auVar104,auVar85);
                        auVar94 = vpshufd_avx(auVar72,0xaa);
                        auVar72 = vblendvps_avx(auVar104,auVar85,auVar94);
                        auVar85 = vblendvps_avx(auVar85,auVar104,auVar94);
                        auVar104 = vpcmpgtd_avx(auVar85,auVar100);
                        auVar94 = vpshufd_avx(auVar104,0xaa);
                        auVar104 = vblendvps_avx(auVar85,auVar100,auVar94);
                        auVar100 = vblendvps_avx(auVar100,auVar85,auVar94);
                        auVar85 = vpcmpgtd_avx(auVar72,auVar93);
                        auVar94 = vpshufd_avx(auVar85,0xaa);
                        auVar85 = vblendvps_avx(auVar72,auVar93,auVar94);
                        auVar72 = vblendvps_avx(auVar93,auVar72,auVar94);
                        auVar93 = vpcmpgtd_avx(auVar104,auVar72);
                        auVar94 = vpshufd_avx(auVar93,0xaa);
                        auVar93 = vblendvps_avx(auVar104,auVar72,auVar94);
                        auVar72 = vblendvps_avx(auVar72,auVar104,auVar94);
                        *pauVar57 = auVar100;
                        pauVar57[1] = auVar72;
                        pauVar57[2] = auVar93;
                        uVar50 = auVar85._0_8_;
                        pauVar57 = pauVar57 + 3;
                      }
                      else {
                        *pauVar57 = auVar100;
                        pauVar57[1] = auVar72;
                        pauVar57[2] = auVar85;
                        pauVar57[3] = auVar104;
                        lVar59 = 0x30;
                        do {
                          lVar61 = lVar59;
                          lVar59 = 0;
                          if (uVar54 != 0) {
                            for (; (uVar54 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                            }
                          }
                          auVar74._8_8_ = 0;
                          auVar74._0_8_ = *(ulong *)(uVar49 + lVar59 * 8);
                          auVar100 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_2540 +
                                                                              lVar59 * 4)));
                          *(undefined1 (*) [16])(pauVar57[1] + lVar61) = auVar100;
                          uVar54 = uVar54 & uVar54 - 1;
                          lVar59 = lVar61 + 0x10;
                        } while (uVar54 != 0);
                        pauVar44 = (undefined1 (*) [16])(pauVar57[1] + lVar61);
                        if (lVar61 + 0x10 != 0) {
                          lVar59 = 0x10;
                          pauVar51 = pauVar57;
                          do {
                            auVar100 = pauVar51[1];
                            uVar119 = *(uint *)(pauVar51[1] + 8);
                            pauVar51 = pauVar51 + 1;
                            lVar61 = lVar59;
                            do {
                              if (uVar119 <= *(uint *)(pauVar57[-1] + lVar61 + 8)) {
                                pauVar53 = (undefined1 (*) [16])(*pauVar57 + lVar61);
                                break;
                              }
                              *(undefined1 (*) [16])(*pauVar57 + lVar61) =
                                   *(undefined1 (*) [16])(pauVar57[-1] + lVar61);
                              lVar61 = lVar61 + -0x10;
                              pauVar53 = pauVar57;
                            } while (lVar61 != 0);
                            *pauVar53 = auVar100;
                            lVar59 = lVar59 + 0x10;
                          } while (pauVar44 != pauVar51);
                        }
                        uVar50 = *(ulong *)*pauVar44;
                        pauVar57 = pauVar44;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar45 = 6;
            }
          } while (iVar45 == 0);
        } while (iVar45 != 6);
        uVar49 = (ulong)((uint)uVar50 & 0xf);
        if (uVar49 != 8) {
          uVar50 = uVar50 & 0xfffffffffffffff0;
          lVar59 = 0;
          do {
            lVar61 = lVar59 * 0xb0;
            pfVar1 = (float *)(uVar50 + 0x80 + lVar61);
            fVar23 = *pfVar1;
            fVar24 = pfVar1[1];
            fVar25 = pfVar1[2];
            fVar26 = pfVar1[3];
            pfVar1 = (float *)(uVar50 + 0x40 + lVar61);
            fVar27 = *pfVar1;
            fVar28 = pfVar1[1];
            fVar29 = pfVar1[2];
            fVar30 = pfVar1[3];
            auVar63._0_4_ = fVar23 * fVar27;
            auVar63._4_4_ = fVar24 * fVar28;
            auVar63._8_4_ = fVar25 * fVar29;
            auVar63._12_4_ = fVar26 * fVar30;
            pfVar1 = (float *)(uVar50 + 0x70 + lVar61);
            fVar31 = *pfVar1;
            fVar32 = pfVar1[1];
            fVar33 = pfVar1[2];
            fVar34 = pfVar1[3];
            pfVar1 = (float *)(uVar50 + 0x50 + lVar61);
            fVar35 = *pfVar1;
            fVar36 = pfVar1[1];
            fVar37 = pfVar1[2];
            fVar38 = pfVar1[3];
            auVar75._0_4_ = fVar31 * fVar35;
            auVar75._4_4_ = fVar32 * fVar36;
            auVar75._8_4_ = fVar33 * fVar37;
            auVar75._12_4_ = fVar34 * fVar38;
            local_2600 = vsubps_avx(auVar75,auVar63);
            auVar100 = *(undefined1 (*) [16])(uVar50 + 0x60 + lVar61);
            fVar130 = auVar100._0_4_;
            auVar76._0_4_ = fVar130 * fVar35;
            fVar132 = auVar100._4_4_;
            auVar76._4_4_ = fVar132 * fVar36;
            fVar133 = auVar100._8_4_;
            auVar76._8_4_ = fVar133 * fVar37;
            fVar134 = auVar100._12_4_;
            auVar76._12_4_ = fVar134 * fVar38;
            pfVar1 = (float *)(uVar50 + 0x30 + lVar61);
            fVar39 = *pfVar1;
            fVar40 = pfVar1[1];
            fVar41 = pfVar1[2];
            fVar42 = pfVar1[3];
            auVar87._0_4_ = fVar23 * fVar39;
            auVar87._4_4_ = fVar24 * fVar40;
            auVar87._8_4_ = fVar25 * fVar41;
            auVar87._12_4_ = fVar26 * fVar42;
            auVar85 = vsubps_avx(auVar87,auVar76);
            auVar88._0_4_ = fVar31 * fVar39;
            auVar88._4_4_ = fVar32 * fVar40;
            auVar88._8_4_ = fVar33 * fVar41;
            auVar88._12_4_ = fVar34 * fVar42;
            auVar135._0_4_ = fVar130 * fVar27;
            auVar135._4_4_ = fVar132 * fVar28;
            auVar135._8_4_ = fVar133 * fVar29;
            auVar135._12_4_ = fVar134 * fVar30;
            local_2630 = vsubps_avx(auVar135,auVar88);
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar136._4_4_ = uVar58;
            auVar136._0_4_ = uVar58;
            auVar136._8_4_ = uVar58;
            auVar136._12_4_ = uVar58;
            local_2590 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + lVar61),auVar136);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar137._4_4_ = uVar58;
            auVar137._0_4_ = uVar58;
            auVar137._8_4_ = uVar58;
            auVar137._12_4_ = uVar58;
            local_2610 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x10 + lVar61),auVar137);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar138._4_4_ = uVar58;
            auVar138._0_4_ = uVar58;
            auVar138._8_4_ = uVar58;
            auVar138._12_4_ = uVar58;
            local_2620 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + lVar61),auVar138);
            fVar62 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar69 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar71 = local_2620._0_4_;
            auVar141._0_4_ = fVar62 * fVar71;
            fVar8 = local_2620._4_4_;
            auVar141._4_4_ = fVar62 * fVar8;
            fVar11 = local_2620._8_4_;
            auVar141._8_4_ = fVar62 * fVar11;
            fVar14 = local_2620._12_4_;
            auVar141._12_4_ = fVar62 * fVar14;
            fVar113 = local_2610._0_4_;
            auVar143._0_4_ = fVar69 * fVar113;
            fVar9 = local_2610._4_4_;
            auVar143._4_4_ = fVar69 * fVar9;
            fVar12 = local_2610._8_4_;
            auVar143._8_4_ = fVar69 * fVar12;
            fVar15 = local_2610._12_4_;
            auVar143._12_4_ = fVar69 * fVar15;
            auVar72 = vsubps_avx(auVar143,auVar141);
            fVar70 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar7 = local_2590._0_4_;
            auVar64._0_4_ = fVar69 * fVar7;
            fVar10 = local_2590._4_4_;
            auVar64._4_4_ = fVar69 * fVar10;
            fVar13 = local_2590._8_4_;
            auVar64._8_4_ = fVar69 * fVar13;
            fVar16 = local_2590._12_4_;
            auVar64._12_4_ = fVar69 * fVar16;
            auVar77._0_4_ = fVar70 * fVar71;
            auVar77._4_4_ = fVar70 * fVar8;
            auVar77._8_4_ = fVar70 * fVar11;
            auVar77._12_4_ = fVar70 * fVar14;
            auVar104 = vsubps_avx(auVar77,auVar64);
            auVar78._0_4_ = fVar70 * fVar113;
            auVar78._4_4_ = fVar70 * fVar9;
            auVar78._8_4_ = fVar70 * fVar12;
            auVar78._12_4_ = fVar70 * fVar15;
            auVar89._0_4_ = fVar62 * fVar7;
            auVar89._4_4_ = fVar62 * fVar10;
            auVar89._8_4_ = fVar62 * fVar13;
            auVar89._12_4_ = fVar62 * fVar16;
            auVar93 = vsubps_avx(auVar89,auVar78);
            auVar94 = local_2630;
            auVar90._0_4_ =
                 local_2600._0_4_ * fVar70 + fVar62 * auVar85._0_4_ + fVar69 * local_2630._0_4_;
            auVar90._4_4_ =
                 local_2600._4_4_ * fVar70 + fVar62 * auVar85._4_4_ + fVar69 * local_2630._4_4_;
            auVar90._8_4_ =
                 local_2600._8_4_ * fVar70 + fVar62 * auVar85._8_4_ + fVar69 * local_2630._8_4_;
            auVar90._12_4_ =
                 local_2600._12_4_ * fVar70 + fVar62 * auVar85._12_4_ + fVar69 * local_2630._12_4_;
            auVar79._8_8_ = 0x8000000080000000;
            auVar79._0_8_ = 0x8000000080000000;
            auVar100 = vandps_avx(auVar90,auVar79);
            uVar119 = auVar100._0_4_;
            local_2540._0_4_ =
                 (float)(uVar119 ^
                        (uint)(fVar130 * auVar72._0_4_ +
                              fVar23 * auVar93._0_4_ + fVar31 * auVar104._0_4_));
            uVar124 = auVar100._4_4_;
            local_2540._4_4_ =
                 (float)(uVar124 ^
                        (uint)(fVar132 * auVar72._4_4_ +
                              fVar24 * auVar93._4_4_ + fVar32 * auVar104._4_4_));
            uVar125 = auVar100._8_4_;
            local_2540._8_4_ =
                 (float)(uVar125 ^
                        (uint)(fVar133 * auVar72._8_4_ +
                              fVar25 * auVar93._8_4_ + fVar33 * auVar104._8_4_));
            uVar126 = auVar100._12_4_;
            local_2540._12_4_ =
                 (float)(uVar126 ^
                        (uint)(fVar134 * auVar72._12_4_ +
                              fVar26 * auVar93._12_4_ + fVar34 * auVar104._12_4_));
            local_2540._16_4_ =
                 (float)(uVar119 ^
                        (uint)(fVar39 * auVar72._0_4_ +
                              fVar35 * auVar93._0_4_ + fVar27 * auVar104._0_4_));
            local_2540._20_4_ =
                 (float)(uVar124 ^
                        (uint)(fVar40 * auVar72._4_4_ +
                              fVar36 * auVar93._4_4_ + fVar28 * auVar104._4_4_));
            local_2540._24_4_ =
                 (float)(uVar125 ^
                        (uint)(fVar41 * auVar72._8_4_ +
                              fVar37 * auVar93._8_4_ + fVar29 * auVar104._8_4_));
            local_2540._28_4_ =
                 (float)(uVar126 ^
                        (uint)(fVar42 * auVar72._12_4_ +
                              fVar38 * auVar93._12_4_ + fVar30 * auVar104._12_4_));
            auVar104 = ZEXT416(0) << 0x20;
            auVar100 = vcmpps_avx(local_2540._0_16_,auVar104,5);
            auVar72 = vcmpps_avx(local_2540._16_16_,auVar104,5);
            auVar100 = vandps_avx(auVar100,auVar72);
            auVar80._8_4_ = 0x7fffffff;
            auVar80._0_8_ = 0x7fffffff7fffffff;
            auVar80._12_4_ = 0x7fffffff;
            local_2510 = vandps_avx(auVar90,auVar80);
            auVar72 = vcmpps_avx(auVar104,auVar90,4);
            auVar100 = vandps_avx(auVar100,auVar72);
            auVar81._0_4_ = local_2540._16_4_ + local_2540._0_4_;
            auVar81._4_4_ = local_2540._20_4_ + local_2540._4_4_;
            auVar81._8_4_ = local_2540._24_4_ + local_2540._8_4_;
            auVar81._12_4_ = local_2540._28_4_ + local_2540._12_4_;
            auVar72 = vcmpps_avx(auVar81,local_2510,2);
            auVar100 = vandps_avx(auVar100,auVar72);
            auVar17._8_8_ = uStack_2548;
            auVar17._0_8_ = local_2550;
            auVar17 = auVar17 & auVar100;
            if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar17[0xf] < '\0') {
              auVar43._8_8_ = uStack_2548;
              auVar43._0_8_ = local_2550;
              auVar100 = vandps_avx(auVar100,auVar43);
              local_2520._0_4_ =
                   (float)(uVar119 ^
                          (uint)(local_2600._0_4_ * fVar7 +
                                fVar113 * auVar85._0_4_ + fVar71 * local_2630._0_4_));
              local_2520._4_4_ =
                   (float)(uVar124 ^
                          (uint)(local_2600._4_4_ * fVar10 +
                                fVar9 * auVar85._4_4_ + fVar8 * local_2630._4_4_));
              local_2520._8_4_ =
                   (float)(uVar125 ^
                          (uint)(local_2600._8_4_ * fVar13 +
                                fVar12 * auVar85._8_4_ + fVar11 * local_2630._8_4_));
              local_2520._12_4_ =
                   (float)(uVar126 ^
                          (uint)(local_2600._12_4_ * fVar16 +
                                fVar15 * auVar85._12_4_ + fVar14 * local_2630._12_4_));
              fVar62 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar69 = local_2510._0_4_;
              auVar65._0_4_ = fVar69 * fVar62;
              fVar70 = local_2510._4_4_;
              auVar65._4_4_ = fVar70 * fVar62;
              fVar71 = local_2510._8_4_;
              auVar65._8_4_ = fVar71 * fVar62;
              fVar113 = local_2510._12_4_;
              auVar65._12_4_ = fVar113 * fVar62;
              auVar72 = vcmpps_avx(auVar65,local_2520,1);
              fVar62 = (ray->super_RayK<1>).tfar;
              auVar82._0_4_ = fVar69 * fVar62;
              auVar82._4_4_ = fVar70 * fVar62;
              auVar82._8_4_ = fVar71 * fVar62;
              auVar82._12_4_ = fVar113 * fVar62;
              auVar104 = vcmpps_avx(local_2520,auVar82,2);
              auVar72 = vandps_avx(auVar104,auVar72);
              auVar104 = auVar100 & auVar72;
              if ((((auVar104 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar104[0xf] < '\0') {
                auVar100 = vandps_avx(auVar100,auVar72);
                local_24f0 = auVar100;
                local_24b0 = local_2600;
                local_2660 = auVar85._0_8_;
                uStack_2658 = auVar85._8_8_;
                local_24a0 = local_2660;
                uStack_2498 = uStack_2658;
                local_2490 = local_2630._0_8_;
                uStack_2488 = local_2630._8_8_;
                auVar72 = vrcpps_avx(local_2510);
                fVar62 = auVar72._0_4_;
                auVar83._0_4_ = fVar69 * fVar62;
                fVar69 = auVar72._4_4_;
                auVar83._4_4_ = fVar70 * fVar69;
                fVar70 = auVar72._8_4_;
                auVar83._8_4_ = fVar71 * fVar70;
                fVar71 = auVar72._12_4_;
                auVar83._12_4_ = fVar113 * fVar71;
                auVar91._8_4_ = 0x3f800000;
                auVar91._0_8_ = &DAT_3f8000003f800000;
                auVar91._12_4_ = 0x3f800000;
                auVar72 = vsubps_avx(auVar91,auVar83);
                fVar62 = fVar62 + fVar62 * auVar72._0_4_;
                fVar69 = fVar69 + fVar69 * auVar72._4_4_;
                fVar70 = fVar70 + fVar70 * auVar72._8_4_;
                fVar71 = fVar71 + fVar71 * auVar72._12_4_;
                local_24c0._0_4_ = fVar62 * local_2520._0_4_;
                local_24c0._4_4_ = fVar69 * local_2520._4_4_;
                local_24c0._8_4_ = fVar70 * local_2520._8_4_;
                local_24c0._12_4_ = fVar71 * local_2520._12_4_;
                local_25f0 = auVar100;
                local_24e0[0] = fVar62 * local_2540._0_4_;
                local_24e0[1] = fVar69 * local_2540._4_4_;
                local_24e0[2] = fVar70 * local_2540._8_4_;
                local_24e0[3] = fVar71 * local_2540._12_4_;
                local_24d0[0] = fVar62 * local_2540._16_4_;
                local_24d0[1] = fVar69 * local_2540._20_4_;
                local_24d0[2] = fVar70 * local_2540._24_4_;
                local_24d0[3] = fVar71 * local_2540._28_4_;
                auVar66._8_4_ = 0x7f800000;
                auVar66._0_8_ = 0x7f8000007f800000;
                auVar66._12_4_ = 0x7f800000;
                auVar72 = vblendvps_avx(auVar66,local_24c0,auVar100);
                auVar85 = vshufps_avx(auVar72,auVar72,0xb1);
                auVar85 = vminps_avx(auVar85,auVar72);
                auVar104 = vshufpd_avx(auVar85,auVar85,1);
                auVar85 = vminps_avx(auVar104,auVar85);
                auVar72 = vcmpps_avx(auVar72,auVar85,0);
                auVar85 = auVar100 & auVar72;
                if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar85[0xf] < '\0') {
                  auVar100 = vandps_avx(auVar72,auVar100);
                }
                lVar61 = lVar61 + uVar50;
                uVar58 = vmovmskps_avx(auVar100);
                uVar54 = CONCAT44((int)((ulong)context >> 0x20),uVar58);
                piVar47 = (int *)0x0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> (long)piVar47 & 1) == 0; piVar47 = (int *)((long)piVar47 + 1)) {
                  }
                }
                local_2590._0_8_ = context->scene;
                pSVar48 = context->scene;
                auVar100 = local_24c0;
                local_2630 = auVar94;
                do {
                  uVar119 = *(uint *)(lVar61 + 0x90 + (long)piVar47 * 4);
                  pGVar4 = (pSVar48->geometries).items[uVar119].ptr;
                  local_2600._0_8_ = pGVar4;
                  if ((pGVar4->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_25f0 + (long)piVar47 * 4) = 0;
                  }
                  else {
                    local_2630._0_8_ = piVar47;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar62 = local_24e0[(long)piVar47];
                      fVar69 = local_24d0[(long)piVar47];
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_24b0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.y =
                           *(float *)((long)&local_24a0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.z =
                           *(float *)((long)&local_2490 + (long)piVar47 * 4);
                      ray->u = fVar62;
                      ray->v = fVar69;
                      ray->primID = *(uint *)(lVar61 + 0xa0 + (long)piVar47 * 4);
                      ray->geomID = uVar119;
                      pRVar5 = context->user;
                      ray->instID[0] = pRVar5->instID[0];
                      ray->instPrimID[0] = pRVar5->instPrimID[0];
                      break;
                    }
                    local_25d8 = context->args;
                    local_25a0 = auVar100;
                    local_2620._0_8_ = uVar52;
                    local_2610._0_8_ = pauVar57;
                    local_25d0.context = context->user;
                    local_2580 = *(float *)(local_24b0 + (long)piVar47 * 4);
                    local_257c = *(undefined4 *)((long)&local_24a0 + (long)piVar47 * 4);
                    local_2578 = *(undefined4 *)((long)&local_2490 + (long)piVar47 * 4);
                    local_2574 = local_24e0[(long)piVar47];
                    local_2570 = local_24d0[(long)piVar47];
                    local_256c = *(undefined4 *)(lVar61 + 0xa0 + (long)piVar47 * 4);
                    local_2568 = uVar119;
                    local_2564 = (local_25d0.context)->instID[0];
                    local_2560 = (local_25d0.context)->instPrimID[0];
                    fVar62 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar47 * 4);
                    local_2634 = -1;
                    local_25d0.valid = &local_2634;
                    local_25d0.geometryUserPtr = pGVar4->userPtr;
                    local_25d0.ray = (RTCRayN *)ray;
                    local_25d0.hit = (RTCHitN *)&local_2580;
                    local_25d0.N = 1;
                    if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->intersectionFilterN)(&local_25d0), *local_25d0.valid != 0)) {
                      if (local_25d8->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_25d8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_2600._0_8_ + 0x3e) & 0x40) != 0)) {
                          (*local_25d8->filter)(&local_25d0);
                        }
                        if (*local_25d0.valid == 0) goto LAB_015c1279;
                      }
                      (((Vec3f *)((long)local_25d0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25d0.hit;
                      (((Vec3f *)((long)local_25d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25d0.hit + 4);
                      (((Vec3f *)((long)local_25d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25d0.hit + 8);
                      *(float *)((long)local_25d0.ray + 0x3c) = *(float *)(local_25d0.hit + 0xc);
                      *(float *)((long)local_25d0.ray + 0x40) = *(float *)(local_25d0.hit + 0x10);
                      *(float *)((long)local_25d0.ray + 0x44) = *(float *)(local_25d0.hit + 0x14);
                      *(float *)((long)local_25d0.ray + 0x48) = *(float *)(local_25d0.hit + 0x18);
                      *(float *)((long)local_25d0.ray + 0x4c) = *(float *)(local_25d0.hit + 0x1c);
                      *(float *)((long)local_25d0.ray + 0x50) = *(float *)(local_25d0.hit + 0x20);
                    }
                    else {
LAB_015c1279:
                      (ray->super_RayK<1>).tfar = fVar62;
                    }
                    *(undefined4 *)(local_25f0 + local_2630._0_8_ * 4) = 0;
                    fVar62 = (ray->super_RayK<1>).tfar;
                    auVar67._4_4_ = fVar62;
                    auVar67._0_4_ = fVar62;
                    auVar67._8_4_ = fVar62;
                    auVar67._12_4_ = fVar62;
                    auVar100 = vcmpps_avx(local_25a0,auVar67,2);
                    local_25f0 = vandps_avx(auVar100,local_25f0);
                    uVar52 = local_2620._0_8_;
                    pauVar57 = (undefined1 (*) [16])local_2610._0_8_;
                    auVar100 = local_25a0;
                  }
                  if ((((local_25f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_25f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_25f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_25f0[0xf]) break;
                  local_2620._0_8_ = uVar52;
                  local_2610._0_8_ = pauVar57;
                  local_25a0 = auVar100;
                  BVHNIntersector1<8,1048576,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect(&local_25d0);
                  piVar47 = local_25d0.valid;
                  pSVar48 = (Scene *)local_2590._0_8_;
                  uVar52 = local_2620._0_8_;
                  pauVar57 = (undefined1 (*) [16])local_2610._0_8_;
                  auVar100 = local_25a0;
                } while( true );
              }
            }
            lVar59 = lVar59 + 1;
          } while (lVar59 != uVar49 - 8);
        }
        fVar62 = (ray->super_RayK<1>).tfar;
        auVar68 = ZEXT3264(CONCAT428(fVar62,CONCAT424(fVar62,CONCAT420(fVar62,CONCAT416(fVar62,
                                                  CONCAT412(fVar62,CONCAT48(fVar62,CONCAT44(fVar62,
                                                  fVar62))))))));
        auVar139 = ZEXT3264(local_2420);
        auVar140 = ZEXT3264(local_2440);
        auVar142 = ZEXT3264(local_2460);
        auVar144 = ZEXT3264(local_2480);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }